

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

Info * __thiscall CMU462::Halfedge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Halfedge *this)

{
  bool bVar1;
  ostream *poVar2;
  HalfedgeIter *pHVar3;
  Halfedge *pHVar4;
  VertexIter *pVVar5;
  Vertex *pVVar6;
  EdgeIter *pEVar7;
  Edge *pEVar8;
  FaceIter *pFVar9;
  Face *pFVar10;
  char *pcVar11;
  value_type local_d78;
  value_type local_d58;
  value_type local_d38;
  value_type local_d18;
  value_type local_cf8;
  value_type local_cd8;
  value_type local_cb8;
  value_type local_c98;
  value_type local_c78;
  value_type local_c58;
  value_type local_c38;
  _List_node_base *local_c18;
  _List_node_base *local_c10;
  _List_node_base *local_c08;
  _List_node_base *local_c00;
  _List_node_base *local_bf8;
  ostringstream local_bf0 [8];
  ostringstream m8;
  ostringstream local_a78 [8];
  ostringstream m7;
  ostringstream local_900 [8];
  ostringstream m6;
  ostringstream local_788 [8];
  ostringstream m5;
  ostringstream local_610 [8];
  ostringstream m4;
  ostringstream local_498 [8];
  ostringstream m3;
  ostringstream local_320 [8];
  ostringstream m2;
  ostringstream local_198 [8];
  ostringstream m1;
  Halfedge *this_local;
  Info *info;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream(local_610);
  std::__cxx11::ostringstream::ostringstream(local_788);
  std::__cxx11::ostringstream::ostringstream(local_900);
  std::__cxx11::ostringstream::ostringstream(local_a78);
  std::__cxx11::ostringstream::ostringstream(local_bf0);
  std::operator<<((ostream *)local_198,"HALFEDGE");
  poVar2 = std::operator<<((ostream *)local_320,"Address: ");
  std::ostream::operator<<(poVar2,this);
  poVar2 = std::operator<<((ostream *)local_498,"Twin: ");
  pHVar3 = twin(this);
  local_bf8 = pHVar3->_M_node;
  pHVar4 = elementAddress((HalfedgeIter)local_bf8);
  std::ostream::operator<<(poVar2,pHVar4);
  poVar2 = std::operator<<((ostream *)local_610,"Next: ");
  pHVar3 = next(this);
  local_c00 = pHVar3->_M_node;
  pHVar4 = elementAddress((HalfedgeIter)local_c00);
  std::ostream::operator<<(poVar2,pHVar4);
  poVar2 = std::operator<<((ostream *)local_788,"Vertex: ");
  pVVar5 = vertex(this);
  local_c08 = pVVar5->_M_node;
  pVVar6 = elementAddress((VertexIter)local_c08);
  std::ostream::operator<<(poVar2,pVVar6);
  poVar2 = std::operator<<((ostream *)local_900,"Edge: ");
  pEVar7 = edge(this);
  local_c10 = pEVar7->_M_node;
  pEVar8 = elementAddress((EdgeIter)local_c10);
  std::ostream::operator<<(poVar2,pEVar8);
  poVar2 = std::operator<<((ostream *)local_a78,"Face: ");
  pFVar9 = face(this);
  local_c18 = pFVar9->_M_node;
  pFVar10 = elementAddress((FaceIter)local_c18);
  std::ostream::operator<<(poVar2,pFVar10);
  poVar2 = std::operator<<((ostream *)local_bf0,"Boundary: ");
  bVar1 = isBoundary(this);
  pcVar11 = "NO";
  if (bVar1) {
    pcVar11 = "YES";
  }
  std::operator<<(poVar2,pcVar11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_c38);
  std::__cxx11::string::~string((string *)&local_c38);
  std::__cxx11::string::string((string *)&local_c58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_c58);
  std::__cxx11::string::~string((string *)&local_c58);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_c78);
  std::__cxx11::string::~string((string *)&local_c78);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_c98);
  std::__cxx11::string::~string((string *)&local_c98);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_cb8);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::__cxx11::string::string((string *)&local_cd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_cf8);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_d18);
  std::__cxx11::string::~string((string *)&local_d18);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_d38);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::string((string *)&local_d58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_d58);
  std::__cxx11::string::~string((string *)&local_d58);
  std::__cxx11::ostringstream::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_d78);
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::ostringstream::~ostringstream(local_bf0);
  std::__cxx11::ostringstream::~ostringstream(local_a78);
  std::__cxx11::ostringstream::~ostringstream(local_900);
  std::__cxx11::ostringstream::~ostringstream(local_788);
  std::__cxx11::ostringstream::~ostringstream(local_610);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

Info Halfedge::getInfo()
  {
    Info info;

    ostringstream m1, m2, m3, m4, m5, m6, m7, m8;
    m1 << "HALFEDGE";
    m2 << "Address: "  << this;
    m3 << "Twin: "     << elementAddress(twin());
    m4 << "Next: "     << elementAddress(next());
    m5 << "Vertex: "   << elementAddress(vertex());
    m6 << "Edge: "     << elementAddress(edge());
    m7 << "Face: "     << elementAddress(face());
    m8 << "Boundary: " << (isBoundary() ? "YES" : "NO");

    info.reserve(8);
    info.push_back(m1.str());
    info.push_back(string());
    info.push_back(m2.str());
    info.push_back(m3.str());
    info.push_back(m4.str());
    info.push_back(string());
    info.push_back(m5.str());
    info.push_back(m6.str());
    info.push_back(m7.str());
    info.push_back(string());
    info.push_back(m8.str());

    return info;
  }